

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedValueExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NamedValueExpression,slang::ast::ValueSymbol_const&,slang::SourceRange&>
          (BumpAllocator *this,ValueSymbol *args,SourceRange *args_1)

{
  SourceRange sourceRange;
  NamedValueExpression *pNVar1;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pNVar1 = (NamedValueExpression *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::NamedValueExpression::NamedValueExpression
            (*(NamedValueExpression **)((long)in_RDX + 8),*(ValueSymbol **)in_RDX,sourceRange);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }